

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O2

void dirEND(void)

{
  char *pcVar1;
  int iVar2;
  undefined8 in_RAX;
  aint val;
  
  pcVar1 = lp;
  val = (aint)((ulong)in_RAX >> 0x20);
  iVar2 = ParseExpression(&lp,&val);
  if (iVar2 != 0) {
    if ((uint)val < 0x10000) {
      StartAddress = val;
      pcVar1 = lp;
    }
    else {
      ErrorInt("[END] Invalid address",4,PASS3);
      pcVar1 = lp;
    }
  }
  lp = pcVar1;
  IsRunning = 0;
  return;
}

Assistant:

static void dirEND() {
	char* p = lp;
	aint val;
	if (ParseExpression(lp, val)) {
		if (val > 65535 || val < 0) ErrorInt("[END] Invalid address", IF_FIRST);
		else 						StartAddress = val;
	} else {
		lp = p;
	}

	IsRunning = 0;
}